

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O1

void QUnicodeTools::Tailored::myanmarAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (0 < len) {
    lVar4 = 0;
    do {
      lVar2 = lVar4 + from;
      lVar5 = 0;
      do {
        lVar3 = len + from;
        if (len + from <= lVar2) goto LAB_00346114;
        cVar1 = text[lVar2];
        if (cVar1 == L'\x200d') {
          uVar6 = 0x12;
        }
        else if (cVar1 == L'\x200c') {
          uVar6 = 9;
        }
        else if ((ushort)(cVar1 + L'\xefa0') < 0xffa0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (ulong)*(ushort *)(mymrCharClasses + (ulong)((ushort)cVar1 & 0x7f) * 4);
        }
        lVar5 = (long)(char)mymrStateTable[uVar6 + lVar5 * 0x13];
        lVar2 = lVar2 + 1;
      } while (-1 < lVar5);
      lVar3 = (lVar2 - (ulong)(lVar5 != -1)) + -1;
LAB_00346114:
      attributes[lVar4 + from] = (QCharAttributes)((byte)attributes[lVar4 + from] | 9);
      lVar2 = lVar3 - from;
      if (len <= lVar3 - from) {
        lVar2 = len;
      }
      lVar4 = lVar4 + 1;
      if (lVar4 < lVar2) {
        do {
          attributes[lVar4 + from] = (QCharAttributes)((byte)attributes[lVar4 + from] & 0xfe);
          lVar4 = lVar4 + 1;
        } while (lVar2 != lVar4);
      }
    } while (lVar4 < len);
  }
  return;
}

Assistant:

static void myanmarAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
    bool invalid;
    qsizetype boundary = myanmar_nextSyllableBoundary(text, from+i, end, &invalid) - from;

    attributes[i].graphemeBoundary = true;
    attributes[i].lineBreak = true;

    if (boundary > len-1)
            boundary = len;
    i++;
    while (i < boundary) {
        attributes[i].graphemeBoundary = false;
        ++i;
    }
    assert(i == boundary);
    }
}